

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::AddUTF8(SQLexer *this,SQUnsignedInteger ch)

{
  ulong in_RSI;
  sqvector<char> *in_RDI;
  char *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  if (in_RSI < 0x80) {
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = 1;
  }
  else if (in_RSI < 0x800) {
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = 2;
  }
  else if (in_RSI < 0x10000) {
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = 3;
  }
  else if (in_RSI < 0x110000) {
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    sqvector<char>::push_back(in_RDI,in_stack_ffffffffffffffc8);
    local_8 = 4;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQInteger SQLexer::AddUTF8(SQUnsignedInteger ch)
{
    if (ch < 0x80) {
        APPEND_CHAR((char)ch);
        return 1;
    }
    if (ch < 0x800) {
        APPEND_CHAR((SQChar)((ch >> 6) | 0xC0));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 2;
    }
    if (ch < 0x10000) {
        APPEND_CHAR((SQChar)((ch >> 12) | 0xE0));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 3;
    }
    if (ch < 0x110000) {
        APPEND_CHAR((SQChar)((ch >> 18) | 0xF0));
        APPEND_CHAR((SQChar)(((ch >> 12) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)(((ch >> 6) & 0x3F) | 0x80));
        APPEND_CHAR((SQChar)((ch & 0x3F) | 0x80));
        return 4;
    }
    return 0;
}